

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample.c
# Opt level: O0

void cubic_coef(spx_word16_t frac,spx_word16_t *interp)

{
  spx_word16_t *interp_local;
  spx_word16_t frac_local;
  
  *interp = frac * -0.16667 + frac * 0.16667 * frac * frac;
  interp[1] = -(frac * 0.5 * frac) * frac + frac * 0.5 * frac + frac;
  interp[3] = -(frac * 0.16667 * frac) * frac + frac * -0.33333 + frac * 0.5 * frac;
  interp[2] = ((1.0 - *interp) - interp[1]) - interp[3];
  return;
}

Assistant:

static void cubic_coef(spx_word16_t frac, spx_word16_t interp[4])
{
   /* Compute interpolation coefficients. I'm not sure whether this corresponds to cubic interpolation
   but I know it's MMSE-optimal on a sinc */
   interp[0] =  -0.16667f*frac + 0.16667f*frac*frac*frac;
   interp[1] = frac + 0.5f*frac*frac - 0.5f*frac*frac*frac;
   /*interp[2] = 1.f - 0.5f*frac - frac*frac + 0.5f*frac*frac*frac;*/
   interp[3] = -0.33333f*frac + 0.5f*frac*frac - 0.16667f*frac*frac*frac;
   /* Just to make sure we don't have rounding problems */
   interp[2] = 1.-interp[0]-interp[1]-interp[3];
}